

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O0

int __thiscall mpt::layout::open(layout *this,char *__file,int __oflag,...)

{
  parser *ppVar1;
  uint uVar2;
  config_parser *this_00;
  char *pcVar3;
  char *fn_local;
  layout *this_local;
  
  if (this->_parse == (parser *)0x0) {
    if (__file == (char *)0x0) {
      this_local._7_1_ = 1;
      goto LAB_0015ce9b;
    }
    this_00 = (config_parser *)operator_new(0x50);
    config_parser::config_parser(this_00);
    this->_parse = (parser *)this_00;
    ppVar1 = this->_parse;
    pcVar3 = file_format();
    uVar2 = (*ppVar1->_vptr_parser[3])(ppVar1,pcVar3);
    if ((uVar2 & 1) == 0) {
      if (this->_parse != (parser *)0x0) {
        (*this->_parse->_vptr_parser[1])();
      }
      this->_parse = (parser *)0x0;
      this_local._7_1_ = 0;
      goto LAB_0015ce9b;
    }
  }
  uVar2 = (*this->_parse->_vptr_parser[4])(this->_parse,__file);
  this = (layout *)((ulong)uVar2 & 0xffffffffffffff01);
  this_local._7_1_ = SUB81(this,0);
LAB_0015ce9b:
  return (int)CONCAT71((int7)((ulong)this >> 8),this_local._7_1_);
}

Assistant:

bool layout::open(const char *fn)
{
	if (!_parse) {
		if (!fn) {
			return true;
		}
		_parse = new config_parser;
		if (!_parse->set_format(file_format())) {
			delete _parse;
			_parse = nullptr;
			return false;
		}
	}
	return _parse->open(fn);
}